

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O0

void Vec_WrdDumpHex(char *pFileName,Vec_Wrd_t *p,int nWords,int fVerbose)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  word *pSim;
  FILE *pFile;
  int nNodes;
  int i;
  int fVerbose_local;
  int nWords_local;
  Vec_Wrd_t *p_local;
  char *pFileName_local;
  
  iVar1 = Vec_WrdSize(p);
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
  }
  else {
    iVar2 = Vec_WrdSize(p);
    if (iVar2 % nWords != 0) {
      __assert_fail("Vec_WrdSize(p) % nWords == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x4f6,"void Vec_WrdDumpHex(char *, Vec_Wrd_t *, int, int)");
    }
    for (pFile._4_4_ = 0; pFile._4_4_ < iVar1 / nWords; pFile._4_4_ = pFile._4_4_ + 1) {
      pSim = Vec_WrdEntryP(p,pFile._4_4_ * nWords);
      Gia_ManSimPatWriteOne((FILE *)__stream,pSim,nWords);
    }
    fclose(__stream);
    if (fVerbose != 0) {
      iVar1 = Vec_WrdSize(p);
      printf("Written %d words of simulation data for %d objects into file \"%s\".\n",
             (ulong)(uint)nWords,(long)iVar1 / (long)nWords & 0xffffffff,pFileName);
    }
  }
  return;
}

Assistant:

static inline void Vec_WrdDumpHex( char * pFileName, Vec_Wrd_t * p, int nWords, int fVerbose )
{
    int i, nNodes = Vec_WrdSize(p) / nWords;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return;
    }
    assert( Vec_WrdSize(p) % nWords == 0 );
    for ( i = 0; i < nNodes; i++ )
        Gia_ManSimPatWriteOne( pFile, Vec_WrdEntryP(p, i*nWords), nWords );
    fclose( pFile );
    if ( fVerbose )
        printf( "Written %d words of simulation data for %d objects into file \"%s\".\n", nWords, Vec_WrdSize(p)/nWords, pFileName );
}